

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp32_s.c
# Opt level: O0

errno_t memcmp32_s(uint32_t *dest,rsize_t dmax,uint32_t *src,rsize_t smax,int *diff)

{
  long lVar1;
  ulong in_RCX;
  int *in_RDX;
  ulong in_RSI;
  int *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  errno_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ulong local_30;
  int *local_28;
  ulong local_20;
  int *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 == (int *)0x0) {
    invoke_safe_mem_constraint_handler
              ((char *)0x0,(void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else {
    *in_R8 = -1;
    if (in_RDI == (int *)0x0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_R8,(void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                 ,in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RDX == (int *)0x0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_R8,(void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                 ,in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_R8,(void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                 ,in_stack_ffffffffffffffbc);
      local_c = 0x191;
    }
    else if (in_RSI < 0x4000001) {
      if (in_RCX == 0) {
        invoke_safe_mem_constraint_handler
                  ((char *)in_R8,
                   (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
        local_c = 0x191;
      }
      else if (in_RSI < in_RCX) {
        invoke_safe_mem_constraint_handler
                  ((char *)in_R8,
                   (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
        local_c = 0x193;
      }
      else if (in_RDI == in_RDX) {
        *in_R8 = 0;
        local_c = 0;
      }
      else {
        *in_R8 = 0;
        local_30 = in_RCX;
        local_28 = in_RDX;
        local_18 = in_RDI;
        for (local_20 = in_RSI; local_20 != 0 && local_30 != 0; local_20 = local_20 - 1) {
          if (*local_18 != *local_28) {
            *in_R8 = *local_18 - *local_28;
            break;
          }
          local_30 = local_30 - 1;
          local_18 = local_18 + 1;
          local_28 = local_28 + 1;
        }
        local_c = 0;
      }
    }
    else {
      invoke_safe_mem_constraint_handler
                ((char *)in_R8,(void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                 ,in_stack_ffffffffffffffbc);
      local_c = 0x193;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcmp32_s (const uint32_t *dest, rsize_t dmax,
            const uint32_t *src,  rsize_t smax, int *diff)
{
    /*
     * must be able to return the diff
     */
    if (diff == NULL) {
        invoke_safe_mem_constraint_handler("memcmp32_s: diff is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }
    *diff = -1;  /* default diff */


    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memcmp32_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (src == NULL) {
        invoke_safe_mem_constraint_handler("memcmp32_s: src is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcmp32_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM32) {
        invoke_safe_mem_constraint_handler("memcmp32_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        invoke_safe_mem_constraint_handler("memcmp32_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
       invoke_safe_mem_constraint_handler("memcmp32_s: smax exceeds dmax",
                  NULL, ESLEMAX);
       return (RCNEGATE(ESLEMAX));
    }

    /*
     * no need to compare the same memory
     */
    if (dest == src) {
        *diff = 0;
        return (RCNEGATE(EOK));
    }

    /*
     * now compare src to dest
     */
    *diff = 0;
    while (dmax != 0 && smax != 0) {
        if (*dest != *src) {
            *diff = *dest - *src;
            break;
        }

        dmax--;
        smax--;

        dest++;
        src++;
    }

    return (RCNEGATE(EOK));
}